

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterHyperCoDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxId SVar8;
  DataKey DVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  double dVar12;
  double dVar13;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (ulong)(uint)(this->bestPricesCo).super_IdxSet.num;
  piVar7 = (this->bestPricesCo).super_IdxSet.idx;
  i = -1;
  dVar1 = -1.0;
  do {
    dVar12 = dVar1;
    uVar11 = uVar10 & 0xffffffff;
    while( true ) {
      uVar10 = uVar10 - 1;
      if ((int)uVar11 < 1) {
        uVar10 = (ulong)(uint)(pSVar4->updateViolsCo).super_IdxSet.num;
        goto LAB_001cc6af;
      }
      iVar2 = piVar7[uVar10];
      dVar1 = pdVar5[iVar2];
      if (dVar1 < -feastol) break;
      iVar3 = (this->bestPricesCo).super_IdxSet.num;
      (this->bestPricesCo).super_IdxSet.num = iVar3 + -1;
      piVar7[uVar10] = piVar7[(long)iVar3 + -1];
      (pSVar4->isInfeasibleCo).data[iVar2] = 0;
      uVar11 = (ulong)((int)uVar11 - 1);
    }
    dVar13 = feastol;
    if (feastol <= pdVar6[iVar2]) {
      dVar13 = pdVar6[iVar2];
    }
    dVar13 = (dVar1 * dVar1) / dVar13;
    if (*best <= dVar13 && dVar13 != *best) {
      *best = dVar13;
      this->last = pdVar6[iVar2];
      i = iVar2;
    }
    dVar1 = dVar13;
    if ((0.0 <= dVar12) && (dVar1 = dVar12, dVar13 < dVar12)) {
      dVar1 = dVar13;
    }
  } while( true );
LAB_001cc6af:
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  uVar11 = uVar10 & 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    if ((int)uVar11 < 1) {
      if (i < 0) {
        DVar9.info = 0;
        DVar9.idx = -1;
        return (SPxId)DVar9;
      }
      SVar8 = SPxSolverBase<double>::id((this->super_SPxPricer<double>).thesolver,i);
      return (SPxId)SVar8.super_DataKey;
    }
    piVar7 = (pSVar4->isInfeasibleCo).data;
    iVar2 = (pSVar4->updateViolsCo).super_IdxSet.idx[uVar10];
    if (piVar7[iVar2] == 1) {
      dVar1 = pdVar5[iVar2];
      if (-feastol <= dVar1) {
        piVar7[iVar2] = 0;
      }
      else {
        dVar13 = feastol;
        if (feastol <= pdVar6[iVar2]) {
          dVar13 = pdVar6[iVar2];
        }
        dVar13 = (dVar1 * dVar1) / dVar13;
        if (dVar12 < dVar13) break;
      }
    }
    uVar11 = (ulong)((int)uVar11 - 1);
  } while( true );
  if (*best <= dVar13 && dVar13 != *best) {
    *best = dVar13;
    this->last = pdVar6[iVar2];
    i = iVar2;
  }
  piVar7[iVar2] = 2;
  DIdxSet::addIdx(&this->bestPricesCo,iVar2);
  goto LAB_001cc6af;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}